

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_wait_release.h
# Opt level: O3

bool __thiscall
kmp_flag_64::wait_cancellable_nosleep
          (kmp_flag_64 *this,kmp_info_t *this_thr,int final_spin,void *itt_sync_obj)

{
  atomic<int> *paVar1;
  kmp_int32 kVar2;
  int iVar3;
  unsigned_long_long *puVar4;
  ompt_lw_taskteam_t *poVar5;
  int iVar6;
  kmp_task_team_t *pkVar7;
  kmp_uint32 local_60;
  int local_50;
  int local_4c;
  void *local_48;
  ompt_state_t local_3c;
  ompt_data_t *local_38;
  
  puVar4 = (this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc;
  local_48 = itt_sync_obj;
  if (final_spin == 0) {
    local_4c = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      local_60 = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar6 = 0;
      if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc !=
          (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        iVar6 = 0;
        do {
          if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014a149:
            pkVar7 = (kmp_task_team_t *)0x0;
          }
          else {
            pkVar7 = (this_thr->th).th_task_team;
            if (pkVar7 == (kmp_task_team_t *)0x0) {
              (this_thr->th).th_reap_state = 1;
              goto LAB_0014a149;
            }
            if ((pkVar7->tt).tt_active == 0) {
              (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_0014a159:
              (this_thr->th).th_reap_state = 1;
            }
            else {
              if ((pkVar7->tt).tt_found_tasks != 1) goto LAB_0014a159;
              __kmp_execute_tasks_64(this_thr,kVar2,this,0,&local_4c,local_48,0);
            }
          }
          if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
              (iVar6 < __kmp_itt_prepare_delay)) &&
             (iVar6 = iVar6 + 1, __kmp_itt_prepare_delay <= iVar6)) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar4);
          }
          if (__kmp_global.g.g_done != 0) {
            if (__kmp_global.g.g_abort != 0) {
              __kmp_abort_thread();
            }
            break;
          }
          if (__kmp_use_yield - 1U < 2) {
            iVar3 = __kmp_avail_proc;
            if (__kmp_avail_proc == 0) {
              iVar3 = __kmp_xproc;
            }
            if (iVar3 < __kmp_nth) {
              __kmp_yield();
            }
            else if ((__kmp_use_yield == 1) && (local_60 = local_60 - 2, local_60 == 0)) {
              __kmp_yield();
              local_60 = __kmp_yield_next;
            }
          }
          if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
             ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1))
          break;
          if (((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
             ((pkVar7 == (kmp_task_team_t *)0x0 || ((pkVar7->tt).tt_found_tasks == 0)))) {
            __kmp_hardware_timestamp();
          }
        } while (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
                  super_kmp_flag_native<unsigned_long_long>.loc !=
                 (this->super_kmp_basic_flag_native<unsigned_long_long>).checker);
      }
      if (((ompt_enabled._0_1_ & 1) != 0) && (*(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar6 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      goto joined_r0x0014a5a1;
    }
  }
  else {
    local_50 = 0;
    if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
         super_kmp_flag_native<unsigned_long_long>.loc !=
        (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
      kVar2 = *(kmp_int32 *)(this_thr->th_pad + 0x24);
      if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
         ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1)) {
        return true;
      }
      this_thr->th_pad[0x548] = '\x01';
      if ((ompt_enabled._0_1_ & 1) != 0) {
        local_3c = *(ompt_state_t *)(this_thr->th_pad + 0x160);
        if ((local_3c == ompt_state_wait_barrier_implicit) &&
           (*(int *)(this_thr->th_pad + 0x20) != 0)) {
          local_38 = (ompt_data_t *)((long)this_thr + 0x150);
        }
        else {
          poVar5 = (((this_thr->th).th_team)->t).ompt_serialized_team_info;
          if (poVar5 == (ompt_lw_taskteam_t *)0x0) {
            local_38 = &(((this_thr->th).th_current_task)->ompt_task_info).task_data;
          }
          else {
            local_38 = &(poVar5->ompt_task_info).task_data;
          }
        }
        if ((__kmp_tasking_mode == tskm_immediate_exec) ||
           ((this_thr->th).th_task_team == (kmp_task_team_t *)0x0)) {
          __ompt_implicit_task_end(this_thr,local_3c,local_38);
        }
      }
      local_60 = __kmp_yield_init;
      if ((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) {
        __kmp_hardware_timestamp();
      }
      iVar6 = 0;
      if (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
           super_kmp_flag_native<unsigned_long_long>.loc !=
          (this->super_kmp_basic_flag_native<unsigned_long_long>).checker) {
        iVar6 = 0;
        do {
          if (__kmp_tasking_mode == tskm_immediate_exec) {
LAB_0014a363:
            pkVar7 = (kmp_task_team_t *)0x0;
          }
          else {
            pkVar7 = (this_thr->th).th_task_team;
            if (pkVar7 == (kmp_task_team_t *)0x0) {
              (this_thr->th).th_reap_state = 1;
              goto LAB_0014a363;
            }
            if ((pkVar7->tt).tt_active == 0) {
              if ((ompt_enabled._0_1_ & 1) != 0) {
                __ompt_implicit_task_end(this_thr,local_3c,local_38);
              }
              (this_thr->th).th_task_team = (kmp_task_team_t *)0x0;
LAB_0014a390:
              (this_thr->th).th_reap_state = 1;
            }
            else {
              if ((pkVar7->tt).tt_found_tasks != 1) goto LAB_0014a390;
              __kmp_execute_tasks_64(this_thr,kVar2,this,1,&local_50,local_48,0);
            }
          }
          if (((__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) &&
              (iVar6 < __kmp_itt_prepare_delay)) &&
             (iVar6 = iVar6 + 1, __kmp_itt_prepare_delay <= iVar6)) {
            (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(puVar4);
          }
          if (__kmp_global.g.g_done != 0) {
            if (__kmp_global.g.g_abort != 0) {
              __kmp_abort_thread();
            }
            break;
          }
          if (__kmp_use_yield - 1U < 2) {
            iVar3 = __kmp_avail_proc;
            if (__kmp_avail_proc == 0) {
              iVar3 = __kmp_xproc;
            }
            if (iVar3 < __kmp_nth) {
              __kmp_yield();
            }
            else if ((__kmp_use_yield == 1) && (local_60 = local_60 - 2, local_60 == 0)) {
              __kmp_yield();
              local_60 = __kmp_yield_next;
            }
          }
          if (((this_thr->th).th_team != (kmp_team_p *)0x0) &&
             ((((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i == 1))
          break;
          if (((__kmp_dflt_blocktime != 0x7fffffff) || (__kmp_pause_status == kmp_soft_paused)) &&
             ((pkVar7 == (kmp_task_team_t *)0x0 || ((pkVar7->tt).tt_found_tasks == 0)))) {
            __kmp_hardware_timestamp();
          }
        } while (*(this->super_kmp_basic_flag_native<unsigned_long_long>).
                  super_kmp_flag_native<unsigned_long_long>.loc !=
                 (this->super_kmp_basic_flag_native<unsigned_long_long>).checker);
      }
      if (((*(ompt_state_t *)(this_thr->th_pad + 0x160) != ompt_state_undefined & ompt_enabled._0_1_
           ) == 1) &&
         (__ompt_implicit_task_end(this_thr,*(ompt_state_t *)(this_thr->th_pad + 0x160),local_38),
         *(int *)(this_thr->th_pad + 0x160) == 0x100)) {
        *(char *)((long)this_thr + 0x160) = '\x01';
        *(char *)((long)this_thr + 0x161) = '\x01';
        *(char *)((long)this_thr + 0x162) = '\0';
        *(char *)((long)this_thr + 0x163) = '\0';
      }
      this_thr->th_pad[0x548] = '\0';
      if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay <= iVar6
         ) {
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
      }
      if ((this_thr->th).th_team == (kmp_team_p *)0x0) {
        return false;
      }
      iVar6 = (((this_thr->th).th_team)->t).t_cancel_request.super___atomic_base<int>._M_i;
      local_4c = local_50;
joined_r0x0014a5a1:
      if (iVar6 != 1) {
        return false;
      }
      if (local_4c != 0) {
        LOCK();
        paVar1 = &(((this_thr->th).th_task_team)->tt).tt_unfinished_threads;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        return true;
      }
      return true;
    }
  }
  if (__kmp_itt_fsync_acquired_ptr__3_0 != (undefined1 *)0x0 && __kmp_itt_prepare_delay < 1) {
    (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(puVar4);
  }
  return false;
}

Assistant:

bool wait_cancellable_nosleep(kmp_info_t *this_thr,
                                int final_spin
                                    USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
    bool retval = false;
    if (final_spin)
      retval = __kmp_wait_template<kmp_flag_64, TRUE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    else
      retval = __kmp_wait_template<kmp_flag_64, FALSE, true, false>(
          this_thr, this USE_ITT_BUILD_ARG(itt_sync_obj));
    return retval;
  }